

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyJson
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix)

{
  byte bVar1;
  Plausibility PVar2;
  ulong uVar3;
  char *__begin2;
  size_t sVar4;
  Plausibility in_R9D;
  int iVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  
  PVar2 = PLAUSIBLE;
  if (prefix.size_ != 0) {
    sVar4 = 0;
    iVar5 = 0;
    do {
      bVar1 = prefix.ptr[sVar4];
      uVar3 = (ulong)bVar1;
      if (iVar5 == 2) {
        if (bVar1 == 0x22) {
          in_R9D = PLAUSIBLE;
          cVar6 = '\x01';
          iVar5 = 2;
        }
        else {
LAB_001208b0:
          bVar7 = (byte)(bVar1 - 1) < 0x1f;
          bVar8 = (bVar1 & 0xfb) != 9;
          cVar6 = bVar1 == 0x7f || (bVar1 != 0xb && bVar7) && (bVar8 && bVar1 != 10);
          if (bVar1 == 0x7f || (bVar1 != 0xb && bVar7) && (bVar8 && bVar1 != 10)) {
            in_R9D = IMPOSSIBLE;
          }
        }
      }
      else if (iVar5 == 1) {
        if (bVar1 != 10) goto LAB_001208b0;
        cVar6 = '\x03';
        iVar5 = 0;
      }
      else {
        cVar6 = '\x03';
        if (bVar1 < 0x30) {
          if ((0x100002e00U >> (uVar3 & 0x3f) & 1) != 0) goto LAB_001208b0;
          if ((uVar3 == 0x23) || (uVar3 == 0x2f)) {
            iVar5 = 1;
            goto LAB_001208f7;
          }
        }
        iVar5 = 2;
        if (bVar1 != 0x7b) {
          cVar6 = '\x01';
          iVar5 = 0;
          in_R9D = IMPOSSIBLE;
        }
      }
LAB_001208f7:
    } while (((cVar6 == '\x03') || (PVar2 = in_R9D, cVar6 == '\0')) &&
            (sVar4 = sVar4 + 1, PVar2 = PLAUSIBLE, prefix.size_ != sVar4));
  }
  return PVar2;
}

Assistant:

Plausibility isPlausiblyJson(kj::ArrayPtr<const byte> prefix) {
    enum { PREAMBLE, COMMENT, BODY } state = PREAMBLE;

    for (char c: prefix.asChars()) {
      switch (state) {
        case PREAMBLE:
          // Before opening parenthesis.
          switch (c) {
            case '{': state = BODY; continue;
            case '#': state = COMMENT; continue;
            case '/': state = COMMENT; continue;
            case ' ':
            case '\n':
            case '\r':
            case '\t':
            case '\v':
              // whitespace
              break;
            default:
              // Not whitespace, not comment, not open brace. Impossible!
              return IMPOSSIBLE;
          }
          break;
        case COMMENT:
          switch (c) {
            case '\n': state = PREAMBLE; continue;
            default: break;
          }
          break;
        case BODY:
          switch (c) {
            case '\"':
              // String literal. Let's stop here before things get complicated.
              return PLAUSIBLE;
            default:
              break;
          }
          break;
      }

      if ((c > 0 && c < ' ' && c != '\n' && c != '\r' && c != '\t' && c != '\v') || c == 0x7f) {
        // Unprintable character.
        return IMPOSSIBLE;
      }
    }

    return PLAUSIBLE;
  }